

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infoPageAnalyzer_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  string inputPage;
  infoPageAnalyzer infoAna;
  ifstream fin;
  string local_298;
  string local_278;
  infoPageAnalyzer local_258;
  long local_220 [4];
  byte abStack_200 [488];
  
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
  std::ifstream::ifstream(local_220,"./testInfo.html",_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    while ((abStack_200[*(long *)(local_220[0] + -0x18)] & 2) == 0) {
      std::istream::get();
      std::__cxx11::string::push_back((char)&local_278);
    }
  }
  std::ifstream::close();
  infoPageAnalyzer::infoPageAnalyzer(&local_258,&local_278);
  infoPageAnalyzer::getComicOriginalName_abi_cxx11_(&local_298,&local_258);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar1 = &local_298.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  infoPageAnalyzer::getComicTranslatedName_abi_cxx11_(&local_298,&local_258);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  infoPageAnalyzer::getFirstPicPageURL_abi_cxx11_(&local_298,&local_258);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  iVar3 = infoPageAnalyzer::getTotalPageNumber(&local_258);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258.super_pageAnalyzer.pageContent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.super_pageAnalyzer.inputPage._M_dataplus._M_p !=
      &local_258.super_pageAnalyzer.inputPage.field_2) {
    operator_delete(local_258.super_pageAnalyzer.inputPage._M_dataplus._M_p,
                    local_258.super_pageAnalyzer.inputPage.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    std::string inputPage = std::string("");

    std::ifstream fin("./testInfo.html", std::ios::in);
    if(fin.is_open())
    {
        while (!fin.eof())
            inputPage += (char)fin.get();
    }
    fin.close();

    infoPageAnalyzer infoAna = infoPageAnalyzer(inputPage);
    std::cout << infoAna.getComicOriginalName() << std::endl;
    std::cout << infoAna.getComicTranslatedName() << std::endl;
    std::cout << infoAna.getFirstPicPageURL() << std::endl;
    std::cout << infoAna.getTotalPageNumber() << std::endl;

    return 0;
}